

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O2

aiColor4D __thiscall
Assimp::AMFImporter::SPP_Material::GetColor
          (SPP_Material *this,float param_1,float param_2,float param_3)

{
  CAMFImporter_NodeElement_Color *pCVar1;
  undefined1 auVar2 [16];
  int iVar3;
  DeadlyImportError *pDVar4;
  undefined4 in_XMM0_Db;
  undefined8 uVar5;
  undefined4 in_XMM1_Db;
  undefined8 uVar6;
  aiColor4D aVar7;
  allocator local_39;
  string local_38;
  
  if ((this->Composition).
      super__List_base<Assimp::AMFImporter::SPP_Composite,_std::allocator<Assimp::AMFImporter::SPP_Composite>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->Composition) {
    pDVar4 = (DeadlyImportError *)
             __cxa_allocate_exception
                       (CONCAT44(in_XMM0_Db,param_1),CONCAT44(in_XMM1_Db,param_2),0x10);
    std::__cxx11::string::string((string *)&local_38,"IME. GetColor for composition",&local_39);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_38);
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pCVar1 = this->Color;
  if (pCVar1->Composed == true) {
    pDVar4 = (DeadlyImportError *)
             __cxa_allocate_exception
                       (CONCAT44(in_XMM0_Db,param_1),CONCAT44(in_XMM1_Db,param_2),0x10);
    std::__cxx11::string::string((string *)&local_38,"IME. GetColor, composed color",&local_39);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_38);
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar5._0_4_ = (pCVar1->Color).r;
  uVar5._4_4_ = (pCVar1->Color).g;
  uVar6._0_4_ = (pCVar1->Color).b;
  uVar6._4_4_ = (pCVar1->Color).a;
  auVar2._4_4_ = -(uint)((float)uVar5._4_4_ != 0.0);
  auVar2._0_4_ = -(uint)((float)(undefined4)uVar5 != 0.0);
  auVar2._8_4_ = -(uint)((float)(undefined4)uVar6 != 0.0);
  auVar2._12_4_ = -(uint)((float)uVar6._4_4_ != 0.0);
  iVar3 = movmskps((int)pCVar1,auVar2);
  if (iVar3 == 0) {
    uVar6 = 0x3f8000003f000000;
    uVar5 = 0x3f0000003f000000;
  }
  aVar7.b = (float)(int)uVar6;
  aVar7.a = (float)(int)((ulong)uVar6 >> 0x20);
  aVar7.r = (float)(int)uVar5;
  aVar7.g = (float)(int)((ulong)uVar5 >> 0x20);
  return aVar7;
}

Assistant:

aiColor4D AMFImporter::SPP_Material::GetColor(const float /*pX*/, const float /*pY*/, const float /*pZ*/) const
{
    aiColor4D tcol;

	// Check if stored data are supported.
	if(!Composition.empty())
	{
		throw DeadlyImportError("IME. GetColor for composition");
	}
	else if(Color->Composed)
	{
		throw DeadlyImportError("IME. GetColor, composed color");
	}
	else
	{
		tcol = Color->Color;
	}

	// Check if default color must be used
	if((tcol.r == 0) && (tcol.g == 0) && (tcol.b == 0) && (tcol.a == 0))
	{
		tcol.r = 0.5f;
		tcol.g = 0.5f;
		tcol.b = 0.5f;
		tcol.a = 1;
	}

	return tcol;
}